

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint encodeLZ77(uivector *out,Hash *hash,uchar *in,size_t inpos,size_t insize,uint windowsize,
               uint minmatch,uint nicematch,uint lazymatching)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uchar *puVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uchar *puVar13;
  uint uVar14;
  uchar *puVar15;
  uint uVar16;
  size_t sVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  uchar *puVar21;
  ulong uVar22;
  uchar *puVar23;
  int iVar24;
  uint uVar25;
  size_t left;
  ulong uVar26;
  size_t left_1;
  ulong uVar27;
  uint uVar28;
  bool bVar29;
  ulong local_60;
  
  uVar5 = windowsize >> 3;
  if (0x1fff < windowsize) {
    uVar5 = windowsize;
  }
  uVar14 = 0x40;
  if (0x1fff < windowsize) {
    uVar14 = 0x102;
  }
  uVar18 = 0x3c;
  if (0xffff7fff < windowsize - 0x8001) {
    uVar10 = windowsize - 1;
    uVar18 = 0x5a;
    if ((windowsize & uVar10) == 0) {
      uVar18 = 0x102;
      if (nicematch < 0x102) {
        uVar18 = nicematch;
      }
      if (inpos < insize) {
        puVar8 = in + insize;
        local_60 = 0;
        uVar4 = 0;
        bVar3 = false;
        uVar16 = 0;
        do {
          uVar6 = getHash(in,insize,inpos);
          uVar27 = 0;
          if (uVar6 == 0) {
            if (uVar16 == 0) {
              puVar15 = in + inpos + 0x102;
              if (puVar8 < in + inpos + 0x102) {
                puVar15 = puVar8;
              }
              puVar21 = in + inpos;
              puVar13 = puVar21;
              for (puVar23 = puVar21; (puVar23 != puVar15 && (puVar13 = puVar23, *puVar23 == '\0'));
                  puVar23 = puVar23 + 1) {
                puVar13 = puVar15;
              }
              uVar27 = (ulong)(uint)((int)puVar13 - (int)puVar21);
            }
            else {
              if ((insize < uVar16 + inpos) || (in[(uVar16 + inpos) - 1] != '\0')) {
                uVar16 = uVar16 - 1;
              }
              uVar27 = (ulong)uVar16;
            }
          }
          uVar16 = (uint)uVar27;
          uVar26 = (ulong)((uint)inpos & uVar10);
          updateHashChain(hash,uVar26,uVar6,(unsigned_short)uVar27);
          uVar9 = inpos + 0x102;
          if (insize <= inpos + 0x102) {
            uVar9 = insize;
          }
          if (uVar5 == 0) {
            uVar11 = 0;
            uVar28 = 0;
          }
          else {
            puVar15 = in + inpos;
            uVar28 = 0;
            uVar11 = 0;
            uVar12 = 0;
            uVar20 = (ulong)hash->chain[uVar26];
            uVar7 = 1;
            do {
              uVar19 = 0;
              if (uVar26 < uVar20) {
                uVar19 = (ulong)windowsize;
              }
              uVar19 = (uVar26 - uVar20) + uVar19;
              if ((uint)uVar19 < (uint)uVar12) break;
              if (uVar19 != 0) {
                puVar21 = in + (inpos - (uVar19 & 0xffffffff));
                puVar23 = puVar15;
                if (2 < uVar16) {
                  uVar12 = (ulong)(uint)hash->zeros[uVar20];
                  if (uVar16 < hash->zeros[uVar20]) {
                    uVar12 = uVar27;
                  }
                  puVar21 = puVar21 + uVar12;
                  puVar23 = puVar15 + uVar12;
                }
                iVar24 = (int)(in + uVar9);
                for (; puVar23 != in + uVar9; puVar23 = puVar23 + 1) {
                  if (*puVar21 != *puVar23) {
                    iVar24 = (int)puVar23;
                    break;
                  }
                  puVar21 = puVar21 + 1;
                }
                uVar25 = iVar24 - (int)puVar15;
                if ((uVar28 < uVar25) &&
                   (uVar11 = uVar19 & 0xffffffff, uVar28 = uVar25, uVar18 <= uVar25)) {
                  uVar11 = uVar19 & 0xffffffff;
                  break;
                }
              }
              uVar2 = hash->chain[uVar20];
              uVar22 = (ulong)uVar2;
              if ((ushort)uVar20 == uVar2) break;
              if ((uVar16 < 3) || (uVar28 <= uVar16)) {
                if (hash->val[uVar2] != uVar6) break;
              }
              else {
                uVar22 = (ulong)hash->chainz[uVar20];
                if (uVar16 != hash->zeros[uVar22]) break;
              }
              bVar29 = uVar7 != uVar5;
              uVar12 = uVar19;
              uVar20 = uVar22;
              uVar7 = uVar7 + 1;
            } while (bVar29);
          }
          uVar7 = (uint)uVar11;
          bVar29 = bVar3;
          if (lazymatching == 0) {
LAB_001156e9:
            if ((2 < uVar28) && (windowsize < uVar7)) {
              return 0x56;
            }
            bVar3 = bVar29;
            if (((uVar28 < 3) || (uVar28 < minmatch)) || ((uVar28 == 3 && (0x1000 < uVar7)))) {
              bVar1 = in[inpos];
              uVar6 = uivector_resize(out,out->size + 1);
              if (uVar6 == 0) {
                return 0x53;
              }
              out->data[out->size - 1] = (uint)bVar1;
            }
            else {
              uVar9 = 0x1c;
              uVar26 = 1;
              do {
                uVar11 = uVar9 + uVar26 >> 1;
                if (LENGTHBASE[uVar11] < uVar28) {
                  uVar26 = uVar11 + 1;
                }
                else {
                  uVar9 = uVar11 - 1;
                }
              } while (uVar26 <= uVar9);
              if ((0x1c < uVar26) || (uVar28 < LENGTHBASE[uVar26])) {
                uVar26 = uVar26 - 1;
              }
              uVar16 = LENGTHBASE[uVar26 & 0xffffffff];
              uVar9 = 0x1d;
              uVar11 = 1;
              do {
                uVar12 = uVar9 + uVar11 >> 1;
                if (DISTANCEBASE[uVar12] < uVar7) {
                  uVar11 = uVar12 + 1;
                }
                else {
                  uVar9 = uVar12 - 1;
                }
              } while (uVar11 <= uVar9);
              if ((0x1d < uVar11) || (uVar7 < DISTANCEBASE[uVar11])) {
                uVar11 = uVar11 - 1;
              }
              uVar6 = DISTANCEBASE[uVar11 & 0xffffffff];
              uVar25 = uivector_resize(out,out->size + 1);
              if (uVar25 != 0) {
                out->data[out->size - 1] = (int)uVar26 + 0x101;
              }
              uVar25 = uivector_resize(out,out->size + 1);
              if (uVar25 != 0) {
                out->data[out->size - 1] = uVar28 - uVar16;
              }
              uVar16 = uivector_resize(out,out->size + 1);
              if (uVar16 != 0) {
                out->data[out->size - 1] = (uint)uVar11;
              }
              uVar16 = uivector_resize(out,out->size + 1);
              if (uVar16 != 0) {
                out->data[out->size - 1] = uVar7 - uVar6;
              }
              uVar6 = 1;
              sVar17 = inpos;
              do {
                uVar16 = (uint)uVar27;
                inpos = sVar17 + 1;
                uVar7 = getHash(in,insize,inpos);
                uVar9 = 0;
                if (uVar7 == 0) {
                  if (uVar16 == 0) {
                    puVar15 = in + sVar17 + 0x103;
                    if (puVar8 < in + sVar17 + 0x103) {
                      puVar15 = puVar8;
                    }
                    puVar13 = in + inpos;
                    puVar23 = puVar13;
                    for (puVar21 = puVar13;
                        (puVar21 != puVar15 && (puVar23 = puVar21, *puVar21 == '\0'));
                        puVar21 = puVar21 + 1) {
                      puVar23 = puVar15;
                    }
                    uVar9 = (ulong)(uint)((int)puVar23 - (int)puVar13);
                  }
                  else {
                    if ((insize < uVar27 + inpos) || (in[uVar27 + sVar17] != '\0')) {
                      uVar16 = uVar16 - 1;
                    }
                    uVar9 = (ulong)uVar16;
                  }
                }
                uVar16 = (uint)uVar9;
                updateHashChain(hash,(ulong)((uint)inpos & uVar10),uVar7,(unsigned_short)uVar9);
                uVar6 = uVar6 + 1;
                sVar17 = inpos;
                uVar27 = uVar9;
              } while (uVar6 != uVar28);
            }
          }
          else {
            if ((bVar3) || (uVar28 < 3)) {
              bVar29 = false;
              if (bVar3) {
                if (inpos == 0) {
                  return 0x51;
                }
                if (uVar4 + 1 < uVar28) {
                  bVar1 = in[inpos - 1];
                  uVar6 = uivector_resize(out,out->size + 1);
                  if (uVar6 == 0) {
                    return 0x53;
                  }
                  out->data[out->size - 1] = (uint)bVar1;
                  bVar29 = false;
                }
                else {
                  hash->head[uVar6] = -1;
                  hash->headz[uVar27] = -1;
                  inpos = inpos - 1;
                  uVar7 = (uint)local_60;
                  uVar28 = uVar4;
                  bVar29 = false;
                }
              }
              goto LAB_001156e9;
            }
            bVar29 = false;
            if (uVar14 < uVar28 || 0x101 < uVar28) goto LAB_001156e9;
            local_60 = uVar11;
            bVar3 = true;
            uVar4 = uVar28;
          }
          inpos = inpos + 1;
        } while (inpos < insize);
      }
      uVar18 = 0;
    }
  }
  return uVar18;
}

Assistant:

static unsigned encodeLZ77(uivector* out, Hash* hash,
	const unsigned char* in, size_t inpos, size_t insize, unsigned windowsize,
	unsigned minmatch, unsigned nicematch, unsigned lazymatching)
{
	size_t pos;
	unsigned i, error = 0;
	/*for large window lengths, assume the user wants no compression loss. Otherwise, max hash chain length speedup.*/
	unsigned maxchainlength = windowsize >= 8192 ? windowsize : windowsize / 8;
	unsigned maxlazymatch = windowsize >= 8192 ? MAX_SUPPORTED_DEFLATE_LENGTH : 64;

	unsigned usezeros = 1; /*not sure if setting it to false for windowsize < 8192 is better or worse*/
	unsigned numzeros = 0;

	unsigned offset; /*the offset represents the distance in LZ77 terminology*/
	unsigned length;
	unsigned lazy = 0;
	unsigned lazylength = 0, lazyoffset = 0;
	unsigned hashval;
	unsigned current_offset, current_length;
	unsigned prev_offset;
	const unsigned char *lastptr, *foreptr, *backptr;
	unsigned hashpos;

	if (windowsize == 0 || windowsize > 32768) return 60; /*error: windowsize smaller/larger than allowed*/
	if ((windowsize & (windowsize - 1)) != 0) return 90; /*error: must be power of two*/

	if (nicematch > MAX_SUPPORTED_DEFLATE_LENGTH) nicematch = MAX_SUPPORTED_DEFLATE_LENGTH;

	for (pos = inpos; pos < insize; ++pos)
	{
		size_t wpos = pos & (windowsize - 1); /*position for in 'circular' hash buffers*/
		unsigned chainlength = 0;

		hashval = getHash(in, insize, pos);

		if (usezeros && hashval == 0)
		{
			if (numzeros == 0) numzeros = countZeros(in, insize, pos);
			else if (pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
		}
		else
		{
			numzeros = 0;
		}

		updateHashChain(hash, wpos, hashval, numzeros);

		/*the length and offset found for the current position*/
		length = 0;
		offset = 0;

		hashpos = hash->chain[wpos];

		lastptr = &in[insize < pos + MAX_SUPPORTED_DEFLATE_LENGTH ? insize : pos + MAX_SUPPORTED_DEFLATE_LENGTH];

		/*search for the longest string*/
		prev_offset = 0;
		for (;;)
		{
			if (chainlength++ >= maxchainlength) break;
			current_offset = hashpos <= wpos ? wpos - hashpos : wpos - hashpos + windowsize;

			if (current_offset < prev_offset) break; /*stop when went completely around the circular buffer*/
			prev_offset = current_offset;
			if (current_offset > 0)
			{
				/*test the next characters*/
				foreptr = &in[pos];
				backptr = &in[pos - current_offset];

				/*common case in PNGs is lots of zeros. Quickly skip over them as a speedup*/
				if (numzeros >= 3)
				{
					unsigned skip = hash->zeros[hashpos];
					if (skip > numzeros) skip = numzeros;
					backptr += skip;
					foreptr += skip;
				}

				while (foreptr != lastptr && *backptr == *foreptr) /*maximum supported length by deflate is max length*/
				{
					++backptr;
					++foreptr;
				}
				current_length = (unsigned)(foreptr - &in[pos]);

				if (current_length > length)
				{
					length = current_length; /*the longest length*/
					offset = current_offset; /*the offset that is related to this longest length*/
					/*jump out once a length of max length is found (speed gain). This also jumps
					out if length is MAX_SUPPORTED_DEFLATE_LENGTH*/
					if (current_length >= nicematch) break;
				}
			}

			if (hashpos == hash->chain[hashpos]) break;

			if (numzeros >= 3 && length > numzeros)
			{
				hashpos = hash->chainz[hashpos];
				if (hash->zeros[hashpos] != numzeros) break;
			}
			else
			{
				hashpos = hash->chain[hashpos];
				/*outdated hash value, happens if particular value was not encountered in whole last window*/
				if (hash->val[hashpos] != (int)hashval) break;
			}
		}

		if (lazymatching)
		{
			if (!lazy && length >= 3 && length <= maxlazymatch && length < MAX_SUPPORTED_DEFLATE_LENGTH)
			{
				lazy = 1;
				lazylength = length;
				lazyoffset = offset;
				continue; /*try the next byte*/
			}
			if (lazy)
			{
				lazy = 0;
				if (pos == 0) ERROR_BREAK(81);
				if (length > lazylength + 1)
				{
					/*push the previous character as literal*/
					if (!uivector_push_back(out, in[pos - 1])) ERROR_BREAK(83 /*alloc fail*/);
				}
				else
				{
					length = lazylength;
					offset = lazyoffset;
					hash->head[hashval] = -1; /*the same hashchain update will be done, this ensures no wrong alteration*/
					hash->headz[numzeros] = -1; /*idem*/
					--pos;
				}
			}
		}
		if (length >= 3 && offset > windowsize) ERROR_BREAK(86 /*too big (or overflown negative) offset*/);

		/*encode it as length/distance pair or literal value*/
		if (length < 3) /*only lengths of 3 or higher are supported as length/distance pair*/
		{
			if (!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
		}
		else if (length < minmatch || (length == 3 && offset > 4096))
		{
			/*compensate for the fact that longer offsets have more extra bits, a
			length of only 3 may be not worth it then*/
			if (!uivector_push_back(out, in[pos])) ERROR_BREAK(83 /*alloc fail*/);
		}
		else
		{
			addLengthDistance(out, length, offset);
			for (i = 1; i < length; ++i)
			{
				++pos;
				wpos = pos & (windowsize - 1);
				hashval = getHash(in, insize, pos);
				if (usezeros && hashval == 0)
				{
					if (numzeros == 0) numzeros = countZeros(in, insize, pos);
					else if (pos + numzeros > insize || in[pos + numzeros - 1] != 0) --numzeros;
				}
				else
				{
					numzeros = 0;
				}
				updateHashChain(hash, wpos, hashval, numzeros);
			}
		}
	} /*end of the loop through each character of input*/

	return error;
}